

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::SPFForceManager::updatePotentials(SPFForceManager *this)

{
  updateLongRangePotentials(this);
  updateShortRangePotentials(this);
  updateSelfPotentials(this);
  updateExcludedPotentials(this);
  updateRestraintPotentials(this);
  if ((this->super_ForceManager).doPotentialSelection_ == true) {
    updateSelectionPotentials(this);
    return;
  }
  return;
}

Assistant:

void SPFForceManager::updatePotentials() {
    updateLongRangePotentials();
    updateShortRangePotentials();
    updateSelfPotentials();
    updateExcludedPotentials();
    updateRestraintPotentials();
    if (doPotentialSelection_) updateSelectionPotentials();
  }